

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O3

parser_error parse_renderer_colors(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *__s;
  size_t sVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  parser_error pVar7;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar7 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s = parser_getstr(p,"colors");
    mem_free(*(void **)((long)pvVar2 + 0x10));
    sVar3 = strlen(__s);
    iVar5 = 0x40;
    if (sVar3 < 0x40) {
      iVar5 = (int)sVar3;
    }
    *(int *)((long)pvVar2 + 0x40) = iVar5;
    pvVar4 = mem_alloc((ulong)(uint)(iVar5 << 2));
    *(void **)((long)pvVar2 + 0x10) = pvVar4;
    iVar5 = *(int *)((long)pvVar2 + 0x40);
    if ((long)iVar5 < 1) {
      pVar7 = PARSE_ERROR_NONE;
    }
    else {
      pVar7 = PARSE_ERROR_NONE;
      lVar6 = 0;
      do {
        iVar1 = color_char_to_attr(__s[lVar6]);
        *(int *)((long)pvVar4 + lVar6 * 4) = iVar1;
        lVar6 = lVar6 + 1;
      } while (iVar5 != lVar6);
    }
  }
  return pVar7;
}

Assistant:

static enum parser_error parse_renderer_colors(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *colors;
	size_t n;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	colors = parser_getstr(p, "colors");
	mem_free(renderer->colors);
	n = strlen(colors);
	renderer->ncolors = (n < MAX_PALETTE) ? (int) n : MAX_PALETTE;
	renderer->colors = mem_alloc(renderer->ncolors *
		sizeof(*renderer->colors));
	convert_chars_to_attrs(colors, renderer->ncolors, renderer->colors);
	return PARSE_ERROR_NONE;
}